

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O0

char * google::protobuf::compiler::objectivec::anon_unknown_5::PrimitiveTypeName
                 (FieldDescriptor *descriptor)

{
  LogMessage *other;
  LogFinisher local_65 [13];
  LogMessage local_58;
  ObjectiveCType local_1c;
  FieldDescriptor *pFStack_18;
  ObjectiveCType type;
  FieldDescriptor *descriptor_local;
  
  pFStack_18 = descriptor;
  local_1c = GetObjectiveCType(descriptor);
  switch(local_1c) {
  case OBJECTIVECTYPE_INT32:
    descriptor_local = (FieldDescriptor *)0x61febf;
    break;
  case OBJECTIVECTYPE_UINT32:
    descriptor_local = (FieldDescriptor *)anon_var_dwarf_371efc;
    break;
  case OBJECTIVECTYPE_INT64:
    descriptor_local = (FieldDescriptor *)0x61fec8;
    break;
  case OBJECTIVECTYPE_UINT64:
    descriptor_local = (FieldDescriptor *)anon_var_dwarf_371f1c;
    break;
  case OBJECTIVECTYPE_FLOAT:
    descriptor_local = (FieldDescriptor *)anon_var_dwarf_45f76;
    break;
  case OBJECTIVECTYPE_DOUBLE:
    descriptor_local = (FieldDescriptor *)anon_var_dwarf_45f6a;
    break;
  case OBJECTIVECTYPE_BOOLEAN:
    descriptor_local = (FieldDescriptor *)0x631a7b;
    break;
  case OBJECTIVECTYPE_STRING:
    descriptor_local = (FieldDescriptor *)anon_var_dwarf_371f50;
    break;
  case OBJECTIVECTYPE_DATA:
    descriptor_local = (FieldDescriptor *)anon_var_dwarf_371f5a;
    break;
  case OBJECTIVECTYPE_ENUM:
    descriptor_local = (FieldDescriptor *)0x61febf;
    break;
  case OBJECTIVECTYPE_MESSAGE:
    descriptor_local = (FieldDescriptor *)0x0;
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_primitive_field.cc"
               ,0x52);
    other = internal::LogMessage::operator<<(&local_58,"Can\'t get here.");
    internal::LogFinisher::operator=(local_65,other);
    internal::LogMessage::~LogMessage(&local_58);
    descriptor_local = (FieldDescriptor *)0x0;
  }
  return (char *)descriptor_local;
}

Assistant:

const char* PrimitiveTypeName(const FieldDescriptor* descriptor) {
  ObjectiveCType type = GetObjectiveCType(descriptor);
  switch (type) {
    case OBJECTIVECTYPE_INT32:
      return "int32_t";
    case OBJECTIVECTYPE_UINT32:
      return "uint32_t";
    case OBJECTIVECTYPE_INT64:
      return "int64_t";
    case OBJECTIVECTYPE_UINT64:
      return "uint64_t";
    case OBJECTIVECTYPE_FLOAT:
      return "float";
    case OBJECTIVECTYPE_DOUBLE:
      return "double";
    case OBJECTIVECTYPE_BOOLEAN:
      return "BOOL";
    case OBJECTIVECTYPE_STRING:
      return "NSString";
    case OBJECTIVECTYPE_DATA:
      return "NSData";
    case OBJECTIVECTYPE_ENUM:
      return "int32_t";
    case OBJECTIVECTYPE_MESSAGE:
      return NULL;  // Messages go through objectivec_message_field.cc|h.
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}